

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O0

int Dau_DsdToGia_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int local_3a4;
  int nVars_1;
  int i;
  int nObjOld;
  int Res_1;
  int Fanins_1 [12];
  word pFunc [64];
  char *q_4;
  Vec_Int_t vLeaves;
  char *q_3;
  char *q2;
  char *q_2;
  char *pOld;
  int *pLits2;
  int Fanins [12];
  int **ppiStack_f0;
  int Res;
  int *pTemp;
  int Temp [3];
  int nVars;
  Gia_Obj_t *pObj;
  int Fan_1;
  int nFans_1;
  int pFans_1 [12];
  char *q_1;
  int Fan;
  int nFans;
  int pFans [12];
  char *q;
  int fCompl;
  Vec_Int_t *vCover_local;
  int *pLits_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  Gia_Man_t *pGia_local;
  
  cVar1 = **p;
  if (cVar1 == '!') {
    *p = *p + 1;
  }
  q._4_4_ = (uint)(cVar1 == '!');
  if ((**p < 'a') || ('l' < **p)) {
    if (**p == '(') {
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      q_1._4_4_ = 0;
      if ((**p != '(') || (*pcVar4 != ')')) {
        __assert_fail("**p == \'(\' && *q == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x115,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      *p = *p + 1;
      while (*p < pcVar4) {
        iVar2 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        Dau_DsdAddToArray(pGia,&Fan,q_1._4_4_,iVar2);
        *p = *p + 1;
        q_1._4_4_ = q_1._4_4_ + 1;
      }
      iVar2 = Dau_DsdBalance(pGia,&Fan,q_1._4_4_,1);
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x11c,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pGia_local._4_4_ = Abc_LitNotCond(iVar2,q._4_4_);
    }
    else if (**p == '[') {
      pFans_1._40_8_ = pStr + pMatches[(long)*p - (long)pStr];
      pObj._4_4_ = 0;
      if ((**p != '[') || (*(char *)pFans_1._40_8_ != ']')) {
        __assert_fail("**p == \'[\' && *q == \']\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x123,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      *p = *p + 1;
      while (*p < (ulong)pFans_1._40_8_) {
        iVar2 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        Dau_DsdAddToArray(pGia,&Fan_1,pObj._4_4_,iVar2);
        *p = *p + 1;
        pObj._4_4_ = pObj._4_4_ + 1;
      }
      iVar2 = Dau_DsdBalance(pGia,&Fan_1,pObj._4_4_,0);
      if (*p != (char *)pFans_1._40_8_) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x12a,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pGia_local._4_4_ = Abc_LitNotCond(iVar2,q._4_4_);
    }
    else if (**p == '<') {
      Temp[1] = 0;
      q_2 = *p;
      pOld = (char *)pLits;
      if (pStr[(long)pMatches[(long)*p - (long)pStr] + 1] == '{') {
        *p = pStr + (long)pMatches[(long)*p - (long)pStr] + 1;
        pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
        if ((**p != '{') || (*pcVar4 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x13b,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        Temp[1] = 0;
        *p = *p + 1;
        while (*p < pcVar4) {
          iVar2 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          Fanins[(long)Temp[1] + -2] = iVar2;
          *p = *p + 1;
          Temp[1] = Temp[1] + 1;
        }
        if (*p != pcVar4) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x13e,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pOld = (char *)&pLits2;
      }
      *p = q_2;
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '<') || (*pcVar4 != '>')) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x146,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (Temp[1] != 0) {
        for (; q_2 < pcVar4; q_2 = q_2 + 1) {
          if ((('`' < *q_2) && (*q_2 < '{')) && (Temp[1] <= *q_2 + -0x61)) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                          ,0x14b,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
        }
      }
      *p = *p + 1;
      ppiStack_f0 = &pTemp;
      while (*p < pcVar4) {
        iVar2 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,(int *)pOld,vCover);
        *(int *)ppiStack_f0 = iVar2;
        *p = *p + 1;
        ppiStack_f0 = (int **)((long)ppiStack_f0 + 4);
      }
      if (ppiStack_f0 != (int **)(Temp + 1)) {
        __assert_fail("pTemp == Temp + 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x14f,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x150,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar4[1] == '{') {
        pcVar4 = *p;
        *p = pcVar4 + 1;
        vLeaves.pArray = (int *)(pStr + pMatches[(long)(pcVar4 + 1) - (long)pStr]);
        if ((**p != '{') || ((char)*vLeaves.pArray != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x154,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        *p = (char *)vLeaves.pArray;
      }
      if (pGia->pMuxes == (uint *)0x0) {
        Fanins[0xb] = Gia_ManHashMux(pGia,(int)pTemp,pTemp._4_4_,Temp[0]);
      }
      else {
        Fanins[0xb] = Gia_ManHashMuxReal(pGia,(int)pTemp,pTemp._4_4_,Temp[0]);
      }
      iVar2 = Abc_Lit2Var(Fanins[0xb]);
      register0x00000000 = Gia_ManObj(pGia,iVar2);
      iVar2 = Gia_ObjIsAnd(register0x00000000);
      if (iVar2 != 0) {
        if (pGia->pMuxes == (uint *)0x0) {
          pGVar5 = Gia_ObjFanin0(stack0xffffffffffffff28);
          iVar2 = Gia_ObjIsAnd(pGVar5);
          if (iVar2 != 0) {
            pGVar5 = Gia_ObjFanin0(stack0xffffffffffffff28);
            Gia_ObjSetAndLevel(pGia,pGVar5);
          }
          pGVar5 = Gia_ObjFanin1(stack0xffffffffffffff28);
          iVar2 = Gia_ObjIsAnd(pGVar5);
          if (iVar2 != 0) {
            pGVar5 = Gia_ObjFanin1(stack0xffffffffffffff28);
            Gia_ObjSetAndLevel(pGia,pGVar5);
          }
          Gia_ObjSetAndLevel(pGia,stack0xffffffffffffff28);
        }
        else {
          Gia_ObjSetMuxLevel(pGia,stack0xffffffffffffff28);
        }
      }
      pGia_local._4_4_ = Abc_LitNotCond(Fanins[0xb],q._4_4_);
    }
    else {
      if (((**p < 'A') || ('F' < **p)) && ((**p < '0' || ('9' < **p)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x184,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      iVar2 = Abc_TtReadHex((word *)(Fanins_1 + 10),*p);
      iVar3 = Abc_TtHexDigitNum(iVar2);
      *p = *p + iVar3;
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '{') || (*pcVar4 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x173,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      local_3a4 = 0;
      *p = *p + 1;
      while (*p < pcVar4) {
        iVar3 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        (&nObjOld)[local_3a4] = iVar3;
        *p = *p + 1;
        local_3a4 = local_3a4 + 1;
      }
      if (local_3a4 != iVar2) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x176,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x177,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      vLeaves._0_8_ = &nObjOld;
      q_4._0_4_ = iVar2;
      q_4._4_4_ = iVar2;
      local_3a4 = Gia_ManObjNum(pGia);
      iVar2 = Kit_TruthToGia(pGia,(uint *)(Fanins_1 + 10),iVar2,vCover,(Vec_Int_t *)&q_4,1);
      for (; iVar3 = Gia_ManObjNum(pGia), local_3a4 < iVar3; local_3a4 = local_3a4 + 1) {
        pGVar5 = Gia_ManObj(pGia,local_3a4);
        Gia_ObjSetGateLevel(pGia,pGVar5);
      }
      m_Non1Step = m_Non1Step + 1;
      pGia_local._4_4_ = Abc_LitNotCond(iVar2,q._4_4_);
    }
  }
  else {
    pGia_local._4_4_ = Abc_LitNotCond(pLits[**p + -0x61],q._4_4_);
  }
  return pGia_local._4_4_;
}

Assistant:

int Dau_DsdToGia_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 1 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 0 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        Gia_Obj_t * pObj;
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        pObj = Gia_ManObj(pGia, Abc_Lit2Var(Res));
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pGia->pMuxes )
                Gia_ObjSetMuxLevel( pGia, pObj );
            else 
            {
                if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
                if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
                Gia_ObjSetAndLevel( pGia, pObj );
            }
        }
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res, nObjOld; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;      
        nObjOld = Gia_ManObjNum(pGia);
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
//        assert( nVars <= 6 );
//        Res = Dau_DsdToGiaCompose_rec( pGia, pFunc[0], Fanins, nVars );
        for ( i = nObjOld; i < Gia_ManObjNum(pGia); i++ )
            Gia_ObjSetGateLevel( pGia, Gia_ManObj(pGia, i) );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}